

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::DiscardVertex::draw(DiscardVertex *this,GLuint primitive_case)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_CaptureVertexInterleaved).m_context)->m_renderCtx->_vptr_RenderContext[3])
                    ();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClear call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1035);
  (**(code **)(lVar3 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1038);
  CaptureVertexInterleaved::draw(&this->super_CaptureVertexInterleaved,primitive_case);
  (**(code **)(lVar3 + 0x4e8))(0x8c89);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glDisable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x103d);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DiscardVertex::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Must clear before rasterizer discard */
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl3cts::TransformFeedback::CaptureVertexInterleaved::draw(primitive_case);

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable call failed.");
}